

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

char * __thiscall expr_tree::strerror_abi_cxx11_(expr_tree *this,int __errnum)

{
  allocator<char> *__a;
  undefined4 in_register_00000034;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*(undefined4 *)(CONCAT44(in_register_00000034,__errnum) + 0x68)) {
  case 1:
    __s = "error: zero power of zero term detected";
    __a = &local_9;
    break;
  case 2:
    __s = "error: division by zero detected";
    __a = &local_a;
    break;
  case 3:
    __s = "error: logarithm of a negative number";
    __a = &local_c;
    break;
  case 4:
    __s = "error: logarithm of zero";
    __a = &local_b;
    break;
  default:
    __s = "semantic error";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,__a);
  return (char *)this;
}

Assistant:

std::string expr_tree::strerror()
{
    switch (errno_)
    {
    case T_ZERO_PWR:
        return "error: zero power of zero term detected";
    case T_ZERO_DIVIZION:
        return "error: division by zero detected";
    case T_LOG_ZERO:
        return "error: logarithm of zero";
    case T_NEGATIVE_ARG:
        return "error: logarithm of a negative number";
    default:
        return "semantic error";
        break;
    }
}